

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackframe.cpp
# Opt level: O0

StackFrameEntry __thiscall stackjit::StackFrame::getArgument(StackFrame *this,size_t index)

{
  RegisterValue *pRVar1;
  FunctionDefinition *this_00;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> *this_01;
  const_reference ppTVar2;
  RegisterValue *argsStart;
  size_t index_local;
  StackFrame *this_local;
  
  pRVar1 = this->mBasePtr;
  this_00 = ManagedFunction::def(this->mFunction);
  this_01 = FunctionDefinition::parameters(this_00);
  ppTVar2 = std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::operator[]
                      (this_01,index);
  StackFrameEntry::StackFrameEntry((StackFrameEntry *)&this_local,pRVar1 + (-1 - index),*ppTVar2);
  return _this_local;
}

Assistant:

StackFrameEntry StackFrame::getArgument(std::size_t index) const {
		RegisterValue* argsStart = mBasePtr - 1;
		return StackFrameEntry(argsStart - index, mFunction->def().parameters()[index]);
	}